

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

double nonius::detail::outlier_variance(estimate<double> mean,estimate<double> stddev,int n)

{
  double *pdVar1;
  int in_EDI;
  __type_conflict1 _Var2;
  double in_stack_00000008;
  anon_class_24_3_0d284b40 var_out;
  anon_class_32_4_9b8c116d c_max;
  double sb2;
  double sg2;
  double sg;
  double mg_min;
  double mn;
  double sb;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  anon_class_24_3_0d284b40 local_80;
  anon_class_32_4_9b8c116d local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  int local_4;
  
  local_10 = (double)var_out._0_8_;
  local_18 = in_stack_00000008 / (double)in_EDI;
  local_20 = local_18 / 2.0;
  local_30 = local_20 / 4.0;
  local_4 = in_EDI;
  _Var2 = std::sqrt<int>(in_EDI);
  local_38 = (double)var_out._0_8_ / _Var2;
  pdVar1 = std::min<double>(&local_30,&local_38);
  local_28 = *pdVar1;
  local_80.sg2 = local_28 * local_28;
  local_80.sb2 = local_10 * local_10;
  local_68.n = local_4;
  local_68.mn = local_18;
  local_80.n = local_4;
  local_68.sb2 = local_80.sb2;
  local_68.sg2 = local_80.sg2;
  local_48 = local_80.sb2;
  local_40 = local_80.sg2;
  local_88 = outlier_variance::anon_class_24_3_0d284b40::operator()(&local_80,1.0);
  local_98 = outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_68,0.0);
  local_a0 = outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_68,local_20);
  pdVar1 = std::min<double>(&local_98,&local_a0);
  local_90 = outlier_variance::anon_class_24_3_0d284b40::operator()(&local_80,*pdVar1);
  pdVar1 = std::min<double>(&local_88,&local_90);
  return *pdVar1 / local_48;
}

Assistant:

inline double outlier_variance(estimate<double> mean, estimate<double> stddev, int n) {
            double sb = stddev.point;
            double mn = mean.point / n;
            double mg_min = mn / 2.;
            double sg = std::min(mg_min / 4., sb / std::sqrt(n));
            double sg2 = sg * sg;
            double sb2 = sb * sb;

            auto c_max = [n, mn, sb2, sg2](double x) -> double {
                double k = mn - x;
                double d = k * k;
                double nd = n * d;
                double k0 = -n * nd;
                double k1 = sb2 - n * sg2 + nd;
                double det = k1 * k1 - 4 * sg2 * k0;
                return (int)(-2. * k0 / (k1 + std::sqrt(det)));
            };

            auto var_out = [n, sb2, sg2](double c) {
                double nc = n - c;
                return (nc / n) * (sb2 - nc * sg2);
            };

            return std::min(var_out(1), var_out(std::min(c_max(0.), c_max(mg_min)))) / sb2;
        }